

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O2

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::get_or_allocate_next_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee,ControlBlock *i_end_control)

{
  bool bVar1;
  PinResult PVar2;
  ControlBlock *pCVar3;
  ControlBlock *i_new_page;
  ControlBlock *pCVar4;
  uintptr_t expected_next;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2> end_block;
  
  if ((i_end_control == (ControlBlock *)0x0) ||
     ((ControlBlock *)((ulong)i_end_control | 0xffc0) != i_end_control ||
      ((ulong)i_end_control & 0x3f) != 0)) {
    density_tests::detail::assert_failed<>
              ("i_end_control != 0 && address_is_aligned(i_end_control, s_alloc_granularity) && i_end_control == get_end_control_block(i_end_control)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x15c);
  }
  if (i_end_control == (ControlBlock *)0xffc0) {
    pCVar3 = create_initial_page(this,i_progress_guarantee);
    return pCVar3;
  }
  end_block.m_pinned_page = (void *)0x0;
  end_block.m_allocator = (basic_default_allocator<65536UL> *)this;
  PVar2 = PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>::pin
                    (&end_block,i_end_control);
  if (PVar2 != PinFailed) {
    pCVar3 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
    if (pCVar3 != i_end_control) goto LAB_00eb5c30;
    i_new_page = create_page(this,i_progress_guarantee);
    if (i_new_page != (ControlBlock *)0x0) {
      expected_next = 8;
      bVar1 = raw_atomic_compare_exchange_strong<unsigned_long>
                        (&i_end_control->m_next,&expected_next,
                         (unsigned_long)((long)&i_new_page->m_next + 2),memory_order_seq_cst);
      if (!bVar1) {
        discard_created_page(this,i_new_page);
        if (expected_next == 0) goto LAB_00eb5c30;
        i_new_page = (ControlBlock *)(expected_next & 0xfffffffffffffff0);
        if (i_new_page == (ControlBlock *)0x0) {
          density_tests::detail::assert_failed<>
                    ("new_page != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
                     ,0x18b);
        }
      }
      LOCK();
      pCVar4 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
      bVar1 = i_end_control == pCVar4;
      if (bVar1) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)i_new_page;
        pCVar4 = i_end_control;
      }
      UNLOCK();
      pCVar3 = i_new_page;
      if (!bVar1) {
        pCVar3 = pCVar4;
      }
      goto LAB_00eb5c30;
    }
  }
  pCVar3 = (ControlBlock *)0x0;
LAB_00eb5c30:
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>::~PinGuard
            (&end_block);
  return pCVar3;
}

Assistant:

ControlBlock * get_or_allocate_next_page(
              LfQueue_ProgressGuarantee i_progress_guarantee, ControlBlock * const i_end_control)
            {
                DENSITY_ASSERT_INTERNAL(
                  i_end_control != 0 && address_is_aligned(i_end_control, s_alloc_granularity) &&
                  i_end_control == get_end_control_block(i_end_control));

                if (i_end_control != reinterpret_cast<ControlBlock *>(s_invalid_control_block))
                {
                    /* We are going to access the content of the end control, so we have to do a safe pin
                        (that is, pin the presumed tail, and then check if the tail has changed in the meanwhile). */
                    PinGuard<ALLOCATOR_TYPE, progress_lock_free> end_block(this);
                    auto const pin_result = end_block.pin(i_end_control);
                    if (pin_result == PinFailed)
                    {
                        return nullptr;
                    }
                    auto const updated_tail =
                      reinterpret_cast<ControlBlock *>(m_tail.load(mem_relaxed));
                    if (updated_tail != i_end_control)
                    {
                        return updated_tail;
                    }
                    // now the end control block is pinned, we can safely access it

                    // allocate and setup a new page
                    auto new_page = create_page(i_progress_guarantee);
                    if (new_page == nullptr)
                    {
                        return nullptr;
                    }

                    uintptr_t expected_next = LfQueue_InvalidNextPage;
                    if (!raw_atomic_compare_exchange_strong(
                          &i_end_control->m_next,
                          &expected_next,
                          reinterpret_cast<uintptr_t>(new_page) + LfQueue_Dead))
                    {
                        /* Some other thread has already linked a new page. We discard the page we
                            have just allocated. */
                        discard_created_page(new_page);

                        /* So i_end_control->m_next may now be the pointer to the next page
                            or 0 (if the page has been consumed in the meanwhile). */
                        if (expected_next == 0)
                        {
                            return updated_tail;
                        }

                        new_page =
                          reinterpret_cast<ControlBlock *>(expected_next & ~LfQueue_AllFlags);

                        DENSITY_ASSERT_INTERNAL(new_page != nullptr);
                        DENSITY_ASSUME_ALIGNED(new_page, ALLOCATOR_TYPE::page_alignment);
                    }

                    auto expected_tail = reinterpret_cast<uintptr_t>(i_end_control);
                    if (m_tail.compare_exchange_strong(
                          expected_tail, reinterpret_cast<uintptr_t>(new_page)))
                        return new_page;
                    else
                        return reinterpret_cast<ControlBlock *>(expected_tail);
                }
                else
                {
                    return create_initial_page(i_progress_guarantee);
                }
            }